

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar4;
  undefined4 extraout_var;
  iterator __it;
  mapped_type *pmVar6;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  key_type local_40;
  Expression *curr_1;
  undefined8 local_30;
  BinaryLocation local_28;
  Expression *pEVar5;
  
  bVar2 = Random::oneIn((Random *)(*(long *)((long)this + 0xe8) + 0x10),10);
  if (bVar2) {
    bVar2 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xe8),curr);
    if (bVar2) {
      vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
      if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_start ==
          (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x30d,
                      "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                     );
      }
      ppEVar4 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)(*(long *)((long)this + 0xe8) + 0x10),vec);
      iVar3 = ExpressionManipulator::copy
                        ((EVP_PKEY_CTX *)*ppEVar4,*(EVP_PKEY_CTX **)((long)this + 0xd8));
      pEVar5 = (Expression *)CONCAT44(extraout_var,iVar3);
      lVar1 = *(long *)((long)this + 200);
      if ((lVar1 != 0) && (*(long *)(lVar1 + 0xf8) != 0)) {
        this_00 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(lVar1 + 0xe0);
        local_40 = (key_type)**this;
        curr_1 = pEVar5;
        __it = std::
               _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(this_00,&local_40);
        if (__it.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_28 = *(BinaryLocation *)
                      ((long)__it.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                             ._M_cur + 0x18);
          local_30 = *(undefined8 *)
                      ((long)__it.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                             ._M_cur + 0x10);
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase(this_00,(const_iterator)
                          __it.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                          ._M_cur);
          pmVar6 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&curr_1);
          pmVar6->columnNumber = local_28;
          pmVar6->fileIndex = (undefined4)local_30;
          pmVar6->lineNumber = local_30._4_4_;
          pEVar5 = curr_1;
        }
      }
      **this = pEVar5;
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }